

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateToken::UpdateModifier
          (TemplateToken *this,
          vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          *auto_modvals)

{
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *this_00;
  pointer *ppMVar1;
  XssClass XVar2;
  pointer pMVar3;
  ModifierInfo *pMVar4;
  ModifierAndValue *pMVar5;
  iterator iVar6;
  char *pcVar7;
  bool bVar8;
  pointer pMVar9;
  pointer ppMVar10;
  ostream *poVar11;
  ulong uVar12;
  ModifierInfo *pMVar13;
  ModifierInfo *extraout_RDX;
  ModifierInfo *modvals;
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals_00;
  ulong uVar14;
  pointer ppMVar15;
  pointer ppMVar16;
  pointer ppMVar17;
  bool bVar18;
  string before;
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->modvals;
  pMVar9 = (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar9 == pMVar3) {
    for (ppMVar15 = (auto_modvals->
                    super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        ppMVar15 !=
        (auto_modvals->
        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppMVar15 = ppMVar15 + 1) {
      pMVar5 = *ppMVar15;
      iVar6._M_current =
           (this->modvals).
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->modvals).
          super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>::
        _M_realloc_insert<ctemplate::ModifierAndValue_const&>
                  ((vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>
                    *)this_00,iVar6,pMVar5);
      }
      else {
        (iVar6._M_current)->value_len = pMVar5->value_len;
        pcVar7 = pMVar5->value;
        (iVar6._M_current)->modifier_info = pMVar5->modifier_info;
        (iVar6._M_current)->value = pcVar7;
        ppMVar1 = &(this->modvals).
                   super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
    }
  }
  else {
    do {
      modvals = pMVar9->modifier_info;
      if (modvals->xss_class == XSS_SAFE) {
        return;
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar3);
    ppMVar10 = (auto_modvals->
               super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    for (ppMVar15 = (auto_modvals->
                    super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish; ppMVar15 != ppMVar10;
        ppMVar15 = ppMVar15 + -1) {
      ppMVar17 = ppMVar15;
      if ((ppMVar15 != ppMVar10) &&
         (pMVar9 = (this->modvals).
                   super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish, ppMVar16 = ppMVar15,
         pMVar9 != (this->modvals).
                   super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   ._M_impl.super__Vector_impl_data._M_start)) {
        while( true ) {
          pMVar9 = pMVar9 + -1;
          ppMVar17 = ppMVar16 + -1;
          bVar8 = IsSafeXSSAlternative(ppMVar16[-1]->modifier_info,pMVar9->modifier_info);
          if ((!bVar8) &&
             ((XVar2 = pMVar9->modifier_info->xss_class, XVar2 == XSS_UNIQUE ||
              (pMVar5 = *ppMVar17, ppMVar17 = ppMVar16, XVar2 != pMVar5->modifier_info->xss_class)))
             ) break;
          ppMVar10 = (auto_modvals->
                     super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          modvals = extraout_RDX;
          if ((ppMVar17 == ppMVar10) ||
             (modvals = (ModifierInfo *)this_00, ppMVar16 = ppMVar17,
             pMVar9 == (this_00->
                       super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                       )._M_impl.super__Vector_impl_data._M_start)) goto LAB_0011f0fa;
        }
        ppMVar10 = (auto_modvals->
                   super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        modvals = extraout_RDX;
        ppMVar17 = ppMVar16;
      }
LAB_0011f0fa:
      if (ppMVar17 == ppMVar10) {
        uVar14 = (long)ppMVar15 - (long)ppMVar10 >> 3;
        goto LAB_0011f152;
      }
    }
    uVar14 = 0;
LAB_0011f152:
    uVar12 = (long)(auto_modvals->
                   super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar10 >> 3;
    if (uVar14 != uVar12) {
      if (uVar12 <= uVar14) {
        __assert_fail("longest_match >= 0 && longest_match < auto_modvals.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x31d,
                      "void ctemplate::TemplateToken::UpdateModifier(const vector<const ModifierAndValue *> &)"
                     );
      }
      pMVar13 = (ModifierInfo *)
                (this->modvals).
                super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar4 = (ModifierInfo *)
               (this->modvals).
               super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pMVar13 == pMVar4) {
        bVar8 = true;
      }
      else {
        pMVar13 = (ModifierInfo *)((long)&(pMVar13->long_name).field_2 + 8);
        do {
          modvals = *(ModifierInfo **)((long)&pMVar13[-1].long_name.field_2 + 8);
          bVar18 = modvals->xss_class == XSS_WEB_STANDARD;
          bVar8 = !bVar18;
          if (bVar18) break;
          modvals = (ModifierInfo *)((long)&(pMVar13->long_name).field_2 + 8);
          bVar18 = pMVar13 != pMVar4;
          pMVar13 = modvals;
        } while (bVar18);
      }
      (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)this_00,
                 (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                  *)modvals);
      for (ppMVar15 = (auto_modvals->
                      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar14;
          ppMVar15 !=
          (auto_modvals->
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          )._M_impl.super__Vector_impl_data._M_finish; ppMVar15 = ppMVar15 + 1) {
        pMVar5 = *ppMVar15;
        iVar6._M_current =
             (this->modvals).
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->modvals).
            super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>::
          _M_realloc_insert<ctemplate::ModifierAndValue_const&>
                    ((vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>
                      *)this_00,iVar6,pMVar5);
        }
        else {
          (iVar6._M_current)->value_len = pMVar5->value_len;
          pcVar7 = pMVar5->value;
          (iVar6._M_current)->modifier_info = pMVar5->modifier_info;
          (iVar6._M_current)->value = pcVar7;
          ppMVar1 = &(this->modvals).
                     super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
      }
      if (!bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Token: ",7);
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,this->text,this->text + this->textlen);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," has missing in-template modifiers. You gave ",0x2d);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," and we computed ",0x11);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
        PrettyPrintModifiers(&local_70,auto_modvals,&local_90);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,". We changed to ",0x10);
        (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
                  (&local_b0,(_anonymous_namespace_ *)this_00,modvals_00);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void UpdateModifier(const vector<const ModifierAndValue*>& auto_modvals) {
    // Common case: no modifiers given in template. Assign our own. No warning.
    if (modvals.empty()) {
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin(); it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      return;
    }

    // Look for any XSS-Safe modifiers (added via AddXssSafeModifier or :none).
    // If one is found anywhere in the vector, consider the variable safe.
    for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
         it != modvals.end(); ++it) {
      if (it->modifier_info->xss_class == XSS_SAFE)
        return;
    }

    size_t longest_match = FindLongestMatch(modvals, auto_modvals);
    if (longest_match == auto_modvals.size()) {
      return;             // We have a complete match, nothing to do.
    } else {              // Copy missing ones and issue warning.
      assert(longest_match >= 0 && longest_match < auto_modvals.size());
      // We only log if one or more of the in-template modifiers was
      // escaping-related which we infer from the XssClass. Currently,
      // all escaping modifiers are in XSS_WEB_STANDARD except for 'none'
      // but that one is handled above.
      bool do_log = false;
      for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
           it != modvals.end(); ++it) {
        if (it->modifier_info->xss_class == XSS_WEB_STANDARD) {
          do_log = true;
          break;
        }
      }
      string before = PrettyPrintTokenModifiers(modvals);  // for logging
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin() + longest_match;
           it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      if (do_log)
        LOG(ERROR)
            << "Token: " << string(text, textlen)
            << " has missing in-template modifiers. You gave " << before
            << " and we computed " << PrettyPrintModifiers(auto_modvals, "")
            << ". We changed to " << PrettyPrintTokenModifiers(modvals) << endl;
    }
  }